

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple.h
# Opt level: O1

void __thiscall Multiple_Zero_Test::~Multiple_Zero_Test(Multiple_Zero_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Multiple, Zero)
{
    BigNumber num_1 = BigNumber("0") * BigNumber("0");
    BigNumber num_2 = BigNumber("0") * BigNumber("1");
    BigNumber num_3 = BigNumber("-1") * BigNumber("0");
    EXPECT_EQ("0", num_1.toString());
    EXPECT_EQ("0", num_2.toString());
    EXPECT_EQ("0", num_3.toString());
}